

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O2

void __thiscall RVO::KdTree::buildObstacleTree(KdTree *this)

{
  pointer ppOVar1;
  size_t i;
  ulong uVar2;
  ObstacleTreeNode *pOVar3;
  vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> obstacles;
  allocator_type local_21;
  _Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> local_20;
  
  deleteObstacleTree(this,this->obstacleTree_);
  std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::vector
            ((vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> *)&local_20,
             (long)(this->sim_->obstacles_).
                   super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->sim_->obstacles_).
                   super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_21);
  for (uVar2 = 0;
      ppOVar1 = (this->sim_->obstacles_).
                super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->sim_->obstacles_).
                            super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3);
      uVar2 = uVar2 + 1) {
    local_20._M_impl.super__Vector_impl_data._M_start[uVar2] = ppOVar1[uVar2];
  }
  pOVar3 = buildObstacleTreeRecursive
                     (this,(vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> *)&local_20);
  this->obstacleTree_ = pOVar3;
  std::_Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::~_Vector_base(&local_20);
  return;
}

Assistant:

void KdTree::buildObstacleTree()
	{
		deleteObstacleTree(obstacleTree_);

		std::vector<Obstacle *> obstacles(sim_->obstacles_.size());

		for (size_t i = 0; i < sim_->obstacles_.size(); ++i) {
			obstacles[i] = sim_->obstacles_[i];
		}

		obstacleTree_ = buildObstacleTreeRecursive(obstacles);
	}